

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus
DecodeBlezlGroupBranch_4(MCInst *MI,uint32_t insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t uVar1;
  uint uVar2;
  int64_t iVar3;
  bool bVar4;
  _Bool HasRs;
  uint32_t Imm;
  uint32_t Rt;
  uint32_t Rs;
  MCRegisterInfo *Decoder_local;
  uint64_t Address_local;
  uint32_t insn_local;
  MCInst *MI_local;
  
  RegNo = fieldFromInstruction(insn,0x15,5);
  RegNo_00 = fieldFromInstruction(insn,0x10,5);
  uVar1 = fieldFromInstruction(insn,0,0x10);
  iVar3 = SignExtend64((ulong)uVar1,0x10);
  bVar4 = false;
  if (RegNo_00 == 0) {
    MI_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    if (RegNo == 0) {
      MCInst_setOpcode(MI,0xee);
    }
    else {
      bVar4 = RegNo != RegNo_00;
      if (bVar4) {
        MCInst_setOpcode(MI,199);
      }
      else {
        MCInst_setOpcode(MI,0xd0);
      }
    }
    if (bVar4) {
      uVar2 = getReg(Decoder,8,RegNo);
      MCOperand_CreateReg0(MI,uVar2);
    }
    uVar2 = getReg(Decoder,8,RegNo_00);
    MCOperand_CreateReg0(MI,uVar2);
    MCOperand_CreateImm0(MI,(ulong)(uint)((int)iVar3 << 2));
    MI_local._4_4_ = MCDisassembler_Success;
  }
  return MI_local._4_4_;
}

Assistant:

static DecodeStatus DecodeBlezlGroupBranch_4(MCInst *MI, uint32_t insn,
		uint64_t Address, MCRegisterInfo *Decoder)
{
	// If we are called then we can assume that MIPS32r6/MIPS64r6 is enabled
	// (otherwise we would have matched the BLEZL instruction from the earlier
	// ISA's instead).
	//
	// We have:
	//    0b010110 sssss ttttt iiiiiiiiiiiiiiii
	//      Invalid if rs == 0
	//      BLEZC   if rs == 0  && rt != 0
	//      BGEZC   if rs == rt && rt != 0
	//      BGEC    if rs != rt && rs != 0  && rt != 0

	uint32_t Rs = fieldFromInstruction(insn, 21, 5);
	uint32_t Rt = fieldFromInstruction(insn, 16, 5);
	uint32_t Imm = (uint32_t)SignExtend64(fieldFromInstruction(insn, 0, 16), 16) * 4;
	bool HasRs = false;

	if (Rt == 0)
		return MCDisassembler_Fail;
	else if (Rs == 0)
		MCInst_setOpcode(MI, Mips_BLEZC);
	else if (Rs == Rt)
		MCInst_setOpcode(MI, Mips_BGEZC);
	else {
		HasRs = true;
		MCInst_setOpcode(MI, Mips_BGEC);
	}

	if (HasRs)
		MCOperand_CreateReg0(MI, getReg(Decoder, Mips_GPR32RegClassID, Rs));

	MCOperand_CreateReg0(MI, getReg(Decoder, Mips_GPR32RegClassID, Rt));

	MCOperand_CreateImm0(MI, Imm);

	return MCDisassembler_Success;
}